

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

void Wlc_ObjSimCo(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  word *pwVar2;
  word *pwVar3;
  ulong uVar4;
  ulong uVar5;
  
  pGVar1 = Gia_ManObj(p,iObj);
  pwVar2 = Wlc_ObjSim(p,iObj);
  pwVar3 = Wlc_ObjSim(p,iObj - (*(uint *)pGVar1 & 0x1fffffff));
  uVar4 = 0;
  if (0 < p->nSimWords) {
    uVar4 = (ulong)(uint)p->nSimWords;
  }
  if ((pGVar1->field_0x3 & 0x20) == 0) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pwVar2[uVar5] = pwVar3[uVar5];
    }
  }
  else {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pwVar2[uVar5] = ~pwVar3[uVar5];
    }
  }
  return;
}

Assistant:

static inline void Wlc_ObjSimCo( Gia_Man_t * p, int iObj )
{
    int w;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    word * pSimCo  = Wlc_ObjSim( p, iObj );
    word * pSimDri = Wlc_ObjSim( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ObjFaninC0(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSimCo[w] = ~pSimDri[w];
    else
        for ( w = 0; w < p->nSimWords; w++ )
            pSimCo[w] =  pSimDri[w];
}